

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDimple::IsValid(ON_SubDimple *this,ON_SubD *subd,bool bSilentError,ON_TextLog *text_log)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint level_index;
  ON_TextLog *in_R8;
  
  bVar3 = ON_SubDHeap::IsValid(&this->m_heap,bSilentError,text_log);
  if (bVar3) {
    uVar1 = (this->m_levels).m_count;
    if (uVar1 != 0) {
      bVar3 = IsValidLevel(this,subd,0,bSilentError,in_R8);
      if (!bVar3) {
        return false;
      }
      uVar2 = 1;
      do {
        level_index = uVar2;
        if (uVar1 == level_index) break;
        bVar3 = IsValidLevel(this,subd,level_index,bSilentError,in_R8);
        uVar2 = level_index + 1;
      } while (bVar3);
      return uVar1 <= level_index;
    }
  }
  else if (text_log != (ON_TextLog *)0x0) {
    ON_TextLog::Print(text_log,
                      "Component ids are not set correctly. m_heap.ResetId() will fix this but may break externally stored component references.\n"
                     );
  }
  ON_SubDIncrementErrorCount();
  if (bSilentError) {
    return false;
  }
  bVar3 = ON_IsNotValid();
  return bVar3;
}

Assistant:

bool ON_SubDimple::IsValid(
  const ON_SubD& subd,
  bool bSilentError,
  ON_TextLog* text_log
  ) const
{
  if (false == m_heap.IsValid(bSilentError, text_log))
  {
    if (nullptr != text_log)
      text_log->Print("Component ids are not set correctly. m_heap.ResetId() will fix this but may break externally stored component references.\n");
    return ON_SubDIsNotValid(bSilentError);
  }

  const unsigned int level_count = m_levels.UnsignedCount();
  if (level_count < 1)
  {
    return ON_SubDIsNotValid(bSilentError);
  }

  for (unsigned int level_index = 0; level_index < level_count; level_index++)
  {
    if (false == IsValidLevel(subd, level_index, bSilentError, text_log))
      return false;
  }  

  return true;
}